

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_visit_message_with_multiple_chars_message_type_Test::TestBody
          (visitor_test_should_visit_message_with_multiple_chars_message_type_Test *this)

{
  char *in_R9;
  undefined1 local_98 [8];
  VisitError<typename_Visitor::ResultType> err;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  doVisit<should_visit_message_with_multiple_chars_message_type::Visitor,DefaultTestRules<Fixpp::v44::Spec::Dictionary>>
            (local_98,"8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248");
  err.storage_.initialized_ = local_98[0];
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (local_98[0] == false) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)&err.storage_.initialized_,
               (AssertionResult *)"err.isOk()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x36a,(char *)gtest_ar_.message_.ptr_);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_);
  Fixpp::result::Result<void,_Fixpp::ErrorKind>::~Result((Result<void,_Fixpp::ErrorKind> *)local_98)
  ;
  return;
}

Assistant:

TEST(visitor_test, should_visit_message_with_multiple_chars_message_type)
{
    const char* frame = "8=FIX.4.4|9=84|35=BF|923=123|924=1|553=username|10=248";

    auto err = doVisit(frame, should_visit_message_with_multiple_chars_message_type::Visitor(), should_visit_message_with_multiple_chars_message_type::VisitRules());
    ASSERT_TRUE(err.isOk());
}